

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_1
asio::buffer<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  size_type sVar1;
  mutable_buffers_1 *data_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  mutable_buffers_1 *this;
  undefined1 local_10 [16];
  
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (sVar1 == 0) {
    data_00 = (mutable_buffers_1 *)0x0;
  }
  else {
    data_00 = (mutable_buffers_1 *)
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  this = data_00;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI)
  ;
  mutable_buffers_1::mutable_buffers_1(this,data_00,0x3d1dab);
  return (mutable_buffers_1)(mutable_buffer)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_MUTABLE_BUFFER buffer(
    std::basic_string<Elem, Traits, Allocator>& data) noexcept
{
  return ASIO_MUTABLE_BUFFER(data.size() ? &data[0] : 0,
      data.size() * sizeof(Elem)
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , detail::buffer_debug_check<
          typename std::basic_string<Elem, Traits, Allocator>::iterator
        >(data.begin())
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}